

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

Vec_Int_t * Sle_ManComputeCuts(Gia_Man_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vTemp;
  int *piVar3;
  Vec_Int_t *p_00;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  double dVar10;
  undefined1 auVar11 [16];
  
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 1000;
  vTemp->nSize = 0;
  piVar3 = (int *)malloc(4000);
  vTemp->pArray = piVar3;
  uVar8 = p->nObjs;
  pVVar9 = p->vCis;
  iVar2 = pVVar9->nSize;
  iVar1 = (~(p->vCos->nSize + iVar2) + uVar8) * 0x1e;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar3;
  if (6 < nLutSize) {
    __assert_fail("nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                  ,0xd2,"Vec_Int_t *Sle_ManComputeCuts(Gia_Man_t *, int, int)");
  }
  if (iVar6 < (int)uVar8) {
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar8 << 2);
    }
    p_00->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset(piVar3,0,(ulong)uVar8 * 4);
    iVar2 = pVVar9->nSize;
  }
  p_00->nSize = uVar8;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      uVar8 = pVVar9->pArray[lVar4];
      if (((long)(int)uVar8 < 0) || (iVar2 = p->nObjs, iVar2 <= (int)uVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar8 == 0) goto LAB_007a9719;
      if (p_00->nSize <= (int)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p_00->pArray[(int)uVar8] = p_00->nSize;
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,(0x10 << ((char)uVar8 +
                                 (char)((ulong)(uVar8 >> 2) * 0x24924925 >> 0x20) * -0x1c & 0x1fU))
                       + 1);
      Vec_IntPush(p_00,uVar8);
      lVar4 = lVar4 + 1;
      pVVar9 = p->vCis;
    } while (lVar4 < pVVar9->nSize);
  }
  iVar2 = p->nObjs;
  if (iVar2 < 1) {
    uVar8 = 0;
  }
  else {
LAB_007a9719:
    lVar7 = 0;
    lVar4 = 0;
    uVar8 = 0;
    do {
      uVar5 = *(uint *)(&p->pObjs->field_0x0 + lVar7);
      if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
        iVar2 = Sle_ManCutMerge(p,(int)lVar4,p_00,vTemp,nLutSize);
        uVar8 = uVar8 + iVar2;
        iVar2 = p->nObjs;
      }
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar4 < iVar2);
  }
  if (fVerbose != 0) {
    uVar5 = ~(p->vCos->nSize + p->vCis->nSize) + iVar2;
    dVar10 = (double)(int)uVar5;
    iVar1 = p_00->nCap;
    auVar11._8_4_ = iVar1 >> 0x1f;
    auVar11._0_8_ = (long)iVar1;
    auVar11._12_4_ = 0x45300000;
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n",
           (double)(int)uVar8 / dVar10,(double)(p_00->nSize - iVar2) / dVar10,
           (((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0) *
           9.5367431640625e-07,(ulong)uVar5,(ulong)uVar8);
  }
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  return p_00;
}

Assistant:

Vec_Int_t * Sle_ManComputeCuts( Gia_Man_t * p, int nLutSize, int fVerbose )
{
    int i, iObj, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    assert( nLutSize <= 6 );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManForEachCiId( p, iObj, i )
    {
        Vec_IntWriteEntry( vCuts, iObj, Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 0 );
        Vec_IntPush( vCuts, Sle_CutSetSizeSign(1, 1<<(iObj % 28)) );
        Vec_IntPush( vCuts, iObj );
    }
    Gia_ManForEachAndId( p, iObj )
        nCuts += Sle_ManCutMerge( p, iObj, vCuts, vTemp, nLutSize );
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.  Mem = %.2f MB.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 
            1.0*(Vec_IntSize(vCuts)-Gia_ManObjNum(p))/Gia_ManAndNum(p), 
            1.0*Vec_IntMemory(vCuts) / (1<<20) );
    Vec_IntFree( vTemp );
    return vCuts;
}